

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc.c
# Opt level: O0

int32_t ll_firmware_type_get(ll_firmware_type_t *t)

{
  _Bool _Var1;
  int32_t local_20;
  int local_1c;
  int32_t ret;
  ll_firmware_type_t *t_local;
  
  if (t == (ll_firmware_type_t *)0x0) {
    t_local._4_4_ = -0x65;
  }
  else {
    _Var1 = transport_mutex_grab();
    if (_Var1) {
      local_1c = hal_read_write(OP_FIRMWARE_TYPE,(uint8_t *)0x0,0,_ll_ifc_msg_buff,4);
      transport_mutex_release();
      if (local_1c != 0) {
        if (local_1c == 4) {
          t->cpu_code = CONCAT11(_ll_ifc_msg_buff[0],_ll_ifc_msg_buff[1]);
          t->functionality_code = CONCAT11(_ll_ifc_msg_buff[2],_ll_ifc_msg_buff[3]);
        }
        else {
          local_1c = -0x66;
        }
      }
      if (local_1c < 0) {
        local_20 = local_1c;
      }
      else {
        local_20 = 0;
      }
      t_local._4_4_ = local_20;
    }
    else {
      t_local._4_4_ = -0x71;
    }
  }
  return t_local._4_4_;
}

Assistant:

int32_t ll_firmware_type_get(ll_firmware_type_t *t)
{

    int32_t ret;
    if(NULL == t)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    ret = hal_read_write(OP_FIRMWARE_TYPE, NULL, 0, &_ll_ifc_msg_buff[0], FIRMWARE_TYPE_LEN);
    transport_mutex_release();

    if (ret == 0)
    {
        //return ret;
    }
    else if(FIRMWARE_TYPE_LEN != ret)
    {
        ret = LL_IFC_ERROR_INCORRECT_RESPONSE_LENGTH;
    }
    else
    {
        t->cpu_code = _ll_ifc_msg_buff[0] << 8 | _ll_ifc_msg_buff[1];
        t->functionality_code = _ll_ifc_msg_buff[2] << 8 | _ll_ifc_msg_buff[3];
    }

    return (ret >= 0) ? LL_IFC_ACK : ret;
}